

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeMinMaxResidualActivity
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,int rowNumber,int colNumber,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minAct,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxAct)

{
  uint *puVar1;
  Item *pIVar2;
  Tolerances *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  Real RVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  double *pdVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar12;
  bool bVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  ulong uVar17;
  long lVar18;
  cpp_dec_float<50U,_int,_void> local_2a8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_268;
  ulong local_260;
  cpp_dec_float<50U,_int,_void> *local_258;
  cpp_dec_float<50U,_int,_void> *local_250;
  double local_248;
  undefined8 uStack_240;
  undefined4 local_238;
  uint uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  pIVar2 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar9 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[rowNumber].idx;
  bVar13 = false;
  local_268 = lp;
  local_250 = &minAct->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&minAct->m_backend,0);
  local_258 = &maxAct->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&maxAct->m_backend,0);
  if (pIVar2[iVar9].data.
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .memused < 1) {
    uVar17 = 0;
  }
  else {
    pIVar2 = pIVar2 + iVar9;
    pdVar10 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_248 = *pdVar10;
    local_238 = SUB84(local_248,0);
    uStack_240 = 0;
    uStack_234 = (uint)((ulong)local_248 >> 0x20) ^ 0x80000000;
    uStack_230 = 0;
    uStack_22c = 0x80000000;
    lVar18 = 0;
    lVar12 = 0;
    local_260 = 0;
    bVar13 = false;
    do {
      if ((colNumber < 0) ||
         (*(int *)((long)(&((pIVar2->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem)->val + 1) + lVar18) != colNumber)) {
        pNVar11 = (pIVar2->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        local_168.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x20);
        puVar1 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18);
        local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x10);
        local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_168.m_backend.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x28);
        local_168.m_backend.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x2c);
        local_168.m_backend._48_8_ =
             *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x30);
        local_68.m_backend.fpclass = cpp_dec_float_finite;
        local_68.m_backend.prec_elem = 10;
        local_68.m_backend.data._M_elems[0] = 0;
        local_68.m_backend.data._M_elems[1] = 0;
        local_68.m_backend.data._M_elems[2] = 0;
        local_68.m_backend.data._M_elems[3] = 0;
        local_68.m_backend.data._M_elems[4] = 0;
        local_68.m_backend.data._M_elems[5] = 0;
        local_68.m_backend.data._M_elems._24_5_ = 0;
        local_68.m_backend.data._M_elems[7]._1_3_ = 0;
        local_68.m_backend.data._M_elems._32_5_ = 0;
        local_68.m_backend._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
        pTVar3 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var4 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        RVar6 = Tolerances::epsilon(pTVar3);
        bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_168,&local_68,RVar6);
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        pNVar11 = (pIVar2->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        if (bVar8) {
          pcVar14 = &(local_268->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
          ::soplex::infinity::__tls_init();
          local_2a8.fpclass = cpp_dec_float_finite;
          local_2a8.prec_elem = 10;
          local_2a8.data._M_elems[0] = 0;
          local_2a8.data._M_elems[1] = 0;
          local_2a8.data._M_elems[2] = 0;
          local_2a8.data._M_elems[3] = 0;
          local_2a8.data._M_elems[4] = 0;
          local_2a8.data._M_elems[5] = 0;
          local_2a8.data._M_elems[6] = 0;
          local_2a8.data._M_elems[7] = 0;
          local_2a8.data._M_elems._32_5_ = 0;
          local_2a8.data._M_elems[9]._1_3_ = 0;
          local_2a8.exp = 0;
          local_2a8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_2a8,
                     (double)CONCAT44(uStack_234,local_238));
          if (((pcVar14->fpclass == cpp_dec_float_NaN) || (local_2a8.fpclass == cpp_dec_float_NaN))
             || (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar14,&local_2a8), 0 < iVar9)) {
            pNVar11 = (pIVar2->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            pcVar14 = &(local_268->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
LAB_003376db:
            local_2a8.fpclass = cpp_dec_float_finite;
            local_2a8.prec_elem = 10;
            local_2a8.neg = false;
            local_2a8.exp = 0;
            local_2a8.data._M_elems[9]._1_3_ = 0;
            local_2a8.data._M_elems._32_5_ = 0;
            local_2a8.data._M_elems[7] = 0;
            local_2a8.data._M_elems[6] = 0;
            local_2a8.data._M_elems[4] = 0;
            local_2a8.data._M_elems[5] = 0;
            local_2a8.data._M_elems[2] = 0;
            local_2a8.data._M_elems[3] = 0;
            local_2a8.data._M_elems[0] = 0;
            local_2a8.data._M_elems[1] = 0;
            pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)&(pNVar11->val).m_backend.data + lVar18);
            pcVar16 = pcVar15;
            if ((&local_2a8 != pcVar14) && (pcVar16 = pcVar14, pcVar15 != &local_2a8)) {
              uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 8);
              local_2a8.data._M_elems._32_5_ = SUB85(uVar5,0);
              local_2a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
              local_2a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar15->data)._M_elems;
              local_2a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 2);
              local_2a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
              uVar5 = *(undefined8 *)((pcVar15->data)._M_elems + 6);
              local_2a8.data._M_elems[6] = (uint)uVar5;
              local_2a8.data._M_elems[7] = (uint)((ulong)uVar5 >> 0x20);
              local_2a8.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x28);
              local_2a8.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x2c);
              local_2a8._48_8_ =
                   *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_2a8,pcVar16);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_250,&local_2a8);
            bVar7 = bVar13;
          }
          else {
            bVar7 = true;
          }
        }
        else {
          local_1a8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x20);
          puVar1 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18);
          local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x10);
          local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_1a8.m_backend.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x28);
          local_1a8.m_backend.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x2c);
          local_1a8.m_backend._48_8_ =
               *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x30);
          local_a8.m_backend.fpclass = cpp_dec_float_finite;
          local_a8.m_backend.prec_elem = 10;
          local_a8.m_backend.data._M_elems[0] = 0;
          local_a8.m_backend.data._M_elems[1] = 0;
          local_a8.m_backend.data._M_elems[2] = 0;
          local_a8.m_backend.data._M_elems[3] = 0;
          local_a8.m_backend.data._M_elems[4] = 0;
          local_a8.m_backend.data._M_elems[5] = 0;
          local_a8.m_backend.data._M_elems._24_5_ = 0;
          local_a8.m_backend.data._M_elems[7]._1_3_ = 0;
          local_a8.m_backend.data._M_elems._32_5_ = 0;
          local_a8.m_backend._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
          pTVar3 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var4 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          RVar6 = Tolerances::epsilon(pTVar3);
          bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (&local_1a8,&local_a8,RVar6);
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          bVar7 = bVar13;
          if (bVar8) {
            pcVar14 = &(local_268->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&((pIVar2->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .m_elem)->val + 1) + lVar18)].m_backend;
            ::soplex::infinity::__tls_init();
            local_2a8.fpclass = cpp_dec_float_finite;
            local_2a8.prec_elem = 10;
            local_2a8.data._M_elems[0] = 0;
            local_2a8.data._M_elems[1] = 0;
            local_2a8.data._M_elems[2] = 0;
            local_2a8.data._M_elems[3] = 0;
            local_2a8.data._M_elems[4] = 0;
            local_2a8.data._M_elems[5] = 0;
            local_2a8.data._M_elems[6] = 0;
            local_2a8.data._M_elems[7] = 0;
            local_2a8.data._M_elems._32_5_ = 0;
            local_2a8.data._M_elems[9]._1_3_ = 0;
            local_2a8.exp = 0;
            local_2a8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2a8,local_248);
            if ((pcVar14->fpclass != cpp_dec_float_NaN) && (local_2a8.fpclass != cpp_dec_float_NaN))
            {
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (pcVar14,&local_2a8);
              bVar7 = true;
              if (-1 < iVar9) goto LAB_0033773b;
            }
            pNVar11 = (pIVar2->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            pcVar14 = &(local_268->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
            goto LAB_003376db;
          }
        }
LAB_0033773b:
        bVar13 = bVar7;
        pNVar11 = (pIVar2->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        local_1e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x20);
        puVar1 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18);
        local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x10);
        local_1e8.m_backend.data._M_elems[4] = *puVar1;
        local_1e8.m_backend.data._M_elems[5] = puVar1[1];
        local_1e8.m_backend.data._M_elems[6] = puVar1[2];
        local_1e8.m_backend.data._M_elems[7] = puVar1[3];
        local_1e8.m_backend.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x28);
        local_1e8.m_backend.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x2c);
        local_1e8.m_backend._48_8_ =
             *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x30);
        local_e8.m_backend.fpclass = cpp_dec_float_finite;
        local_e8.m_backend.prec_elem = 10;
        local_e8.m_backend.data._M_elems[0] = 0;
        local_e8.m_backend.data._M_elems[1] = 0;
        local_e8.m_backend.data._M_elems[2] = 0;
        local_e8.m_backend.data._M_elems[3] = 0;
        local_e8.m_backend.data._M_elems[4] = 0;
        local_e8.m_backend.data._M_elems[5] = 0;
        local_e8.m_backend.data._M_elems._24_5_ = 0;
        local_e8.m_backend.data._M_elems[7]._1_3_ = 0;
        local_e8.m_backend.data._M_elems._32_5_ = 0;
        local_e8.m_backend._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_e8,0.0);
        pTVar3 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var4 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        RVar6 = Tolerances::epsilon(pTVar3);
        bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_1e8,&local_e8,RVar6);
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        pNVar11 = (pIVar2->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        if (bVar8) {
          pcVar14 = &(local_268->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
          ::soplex::infinity::__tls_init();
          local_2a8.fpclass = cpp_dec_float_finite;
          local_2a8.prec_elem = 10;
          local_2a8.data._M_elems[0] = 0;
          local_2a8.data._M_elems[1] = 0;
          local_2a8.data._M_elems[2] = 0;
          local_2a8.data._M_elems[3] = 0;
          local_2a8.data._M_elems[4] = 0;
          local_2a8.data._M_elems[5] = 0;
          local_2a8.data._M_elems[6] = 0;
          local_2a8.data._M_elems[7] = 0;
          local_2a8.data._M_elems._32_5_ = 0;
          local_2a8.data._M_elems[9]._1_3_ = 0;
          local_2a8.exp = 0;
          local_2a8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_2a8,local_248);
          if ((pcVar14->fpclass != cpp_dec_float_NaN) && (local_2a8.fpclass != cpp_dec_float_NaN)) {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar14,&local_2a8);
            if (-1 < iVar9) {
              local_260 = CONCAT71((int7)(CONCAT44(extraout_var,iVar9) >> 8),1);
              goto LAB_00337b96;
            }
          }
          pNVar11 = (pIVar2->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pcVar14 = (cpp_dec_float<50U,_int,_void> *)((long)&(pNVar11->val).m_backend.data + lVar18)
          ;
          pcVar15 = &(local_268->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
          local_2a8.fpclass = cpp_dec_float_finite;
          local_2a8.prec_elem = 10;
          local_2a8.data._M_elems[0] = 0;
          local_2a8.data._M_elems[1] = 0;
          local_2a8.data._M_elems[2] = 0;
          local_2a8.data._M_elems[3] = 0;
          local_2a8.data._M_elems[4] = 0;
          local_2a8.data._M_elems[5] = 0;
          local_2a8.data._M_elems[6] = 0;
          local_2a8.data._M_elems[7] = 0;
          local_2a8.data._M_elems._32_5_ = 0;
          local_2a8.data._M_elems[9]._1_3_ = 0;
          local_2a8.exp = 0;
          local_2a8.neg = false;
          pcVar16 = pcVar14;
          if ((&local_2a8 != pcVar15) && (pcVar16 = pcVar15, pcVar14 != &local_2a8)) {
            uVar5 = *(undefined8 *)((pcVar14->data)._M_elems + 8);
            local_2a8.data._M_elems._32_5_ = SUB85(uVar5,0);
            local_2a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_2a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
            local_2a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
            local_2a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
            local_2a8.data._M_elems[6] = (pcVar14->data)._M_elems[6];
            local_2a8.data._M_elems[7] = (pcVar14->data)._M_elems[7];
            local_2a8.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x28);
            local_2a8.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x2c);
            local_2a8._48_8_ = *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x30)
            ;
          }
        }
        else {
          local_228.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x20);
          puVar1 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18);
          local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_228.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x10);
          local_228.m_backend.data._M_elems[4] = *puVar1;
          local_228.m_backend.data._M_elems[5] = puVar1[1];
          local_228.m_backend.data._M_elems[6] = puVar1[2];
          local_228.m_backend.data._M_elems[7] = puVar1[3];
          local_228.m_backend.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x28);
          local_228.m_backend.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x2c);
          local_228.m_backend._48_8_ =
               *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x30);
          local_128.m_backend.fpclass = cpp_dec_float_finite;
          local_128.m_backend.prec_elem = 10;
          local_128.m_backend.data._M_elems[0] = 0;
          local_128.m_backend.data._M_elems[1] = 0;
          local_128.m_backend.data._M_elems[2] = 0;
          local_128.m_backend.data._M_elems[3] = 0;
          local_128.m_backend.data._M_elems[4] = 0;
          local_128.m_backend.data._M_elems[5] = 0;
          local_128.m_backend.data._M_elems._24_5_ = 0;
          local_128.m_backend.data._M_elems[7]._1_3_ = 0;
          local_128.m_backend.data._M_elems._32_5_ = 0;
          local_128.m_backend._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_128,0.0);
          pTVar3 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var4 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          RVar6 = Tolerances::epsilon(pTVar3);
          bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (&local_228,&local_128,RVar6);
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          if (!bVar8) goto LAB_00337b96;
          pcVar14 = &(local_268->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&((pIVar2->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .m_elem)->val + 1) + lVar18)].m_backend;
          ::soplex::infinity::__tls_init();
          local_2a8.fpclass = cpp_dec_float_finite;
          local_2a8.prec_elem = 10;
          local_2a8.data._M_elems[0] = 0;
          local_2a8.data._M_elems[1] = 0;
          local_2a8.data._M_elems[2] = 0;
          local_2a8.data._M_elems[3] = 0;
          local_2a8.data._M_elems[4] = 0;
          local_2a8.data._M_elems[5] = 0;
          local_2a8.data._M_elems[6] = 0;
          local_2a8.data._M_elems[7] = 0;
          local_2a8.data._M_elems._32_5_ = 0;
          local_2a8.data._M_elems[9]._1_3_ = 0;
          local_2a8.exp = 0;
          local_2a8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_2a8,
                     (double)CONCAT44(uStack_234,local_238));
          if ((pcVar14->fpclass != cpp_dec_float_NaN) && (local_2a8.fpclass != cpp_dec_float_NaN)) {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar14,&local_2a8);
            if (iVar9 < 1) {
              local_260 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar9) >> 8),1);
              goto LAB_00337b96;
            }
          }
          pNVar11 = (pIVar2->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pcVar14 = (cpp_dec_float<50U,_int,_void> *)((long)&(pNVar11->val).m_backend.data + lVar18)
          ;
          pcVar15 = &(local_268->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
          local_2a8.fpclass = cpp_dec_float_finite;
          local_2a8.prec_elem = 10;
          local_2a8.data._M_elems[0] = 0;
          local_2a8.data._M_elems[1] = 0;
          local_2a8.data._M_elems[2] = 0;
          local_2a8.data._M_elems[3] = 0;
          local_2a8.data._M_elems[4] = 0;
          local_2a8.data._M_elems[5] = 0;
          local_2a8.data._M_elems[6] = 0;
          local_2a8.data._M_elems[7] = 0;
          local_2a8.data._M_elems._32_5_ = 0;
          local_2a8.data._M_elems[9]._1_3_ = 0;
          local_2a8.exp = 0;
          local_2a8.neg = false;
          pcVar16 = pcVar14;
          if ((&local_2a8 != pcVar15) && (pcVar16 = pcVar15, pcVar14 != &local_2a8)) {
            uVar5 = *(undefined8 *)((pcVar14->data)._M_elems + 8);
            local_2a8.data._M_elems._32_5_ = SUB85(uVar5,0);
            local_2a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_2a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
            local_2a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
            local_2a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
            local_2a8.data._M_elems[6] = (pcVar14->data)._M_elems[6];
            local_2a8.data._M_elems[7] = (pcVar14->data)._M_elems[7];
            local_2a8.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x28);
            local_2a8.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x2c);
            local_2a8._48_8_ = *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x30)
            ;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_2a8,pcVar16);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (local_258,&local_2a8);
      }
LAB_00337b96:
      lVar12 = lVar12 + 1;
      lVar18 = lVar18 + 0x3c;
      uVar17 = local_260;
    } while (lVar12 < (pIVar2->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if (bVar13) {
    ::soplex::infinity::__tls_init();
    pdVar10 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_2a8.fpclass = cpp_dec_float_finite;
    local_2a8.prec_elem = 10;
    local_2a8.data._M_elems[0] = 0;
    local_2a8.data._M_elems[1] = 0;
    local_2a8.data._M_elems[2] = 0;
    local_2a8.data._M_elems[3] = 0;
    local_2a8.data._M_elems[4] = 0;
    local_2a8.data._M_elems[5] = 0;
    local_2a8.data._M_elems[6] = 0;
    local_2a8.data._M_elems[7] = 0;
    local_2a8.data._M_elems._32_5_ = 0;
    local_2a8.data._M_elems[9]._1_3_ = 0;
    local_2a8.exp = 0;
    local_2a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_2a8,-*pdVar10);
    *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_250->data)->data)._M_elems =
         local_2a8.data._M_elems._0_8_;
    *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_250->data)->data)._M_elems + 2) =
         local_2a8.data._M_elems._8_8_;
    *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_250->data)->data)._M_elems + 4) =
         local_2a8.data._M_elems._16_8_;
    *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_250->data)->data)._M_elems + 6) =
         CONCAT44(local_2a8.data._M_elems[7],local_2a8.data._M_elems[6]);
    *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_250->data)->data)._M_elems + 8) =
         CONCAT35(local_2a8.data._M_elems[9]._1_3_,local_2a8.data._M_elems._32_5_);
    local_250->exp = local_2a8.exp;
    local_250->neg = local_2a8.neg;
    local_250->fpclass = local_2a8.fpclass;
    local_250->prec_elem = local_2a8.prec_elem;
  }
  if ((uVar17 & 1) != 0) {
    ::soplex::infinity::__tls_init();
    pdVar10 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_2a8.fpclass = cpp_dec_float_finite;
    local_2a8.prec_elem = 10;
    local_2a8.data._M_elems[0] = 0;
    local_2a8.data._M_elems[1] = 0;
    local_2a8.data._M_elems[2] = 0;
    local_2a8.data._M_elems[3] = 0;
    local_2a8.data._M_elems[4] = 0;
    local_2a8.data._M_elems[5] = 0;
    local_2a8.data._M_elems[6] = 0;
    local_2a8.data._M_elems[7] = 0;
    local_2a8.data._M_elems._32_5_ = 0;
    local_2a8.data._M_elems[9]._1_3_ = 0;
    local_2a8.exp = 0;
    local_2a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_2a8,*pdVar10);
    *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_258->data)->data)._M_elems =
         local_2a8.data._M_elems._0_8_;
    *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_258->data)->data)._M_elems + 2) =
         local_2a8.data._M_elems._8_8_;
    *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_258->data)->data)._M_elems + 4) =
         local_2a8.data._M_elems._16_8_;
    *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_258->data)->data)._M_elems + 6) =
         CONCAT44(local_2a8.data._M_elems[7],local_2a8.data._M_elems[6]);
    *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_258->data)->data)._M_elems + 8) =
         CONCAT35(local_2a8.data._M_elems[9]._1_3_,local_2a8.data._M_elems._32_5_);
    local_258->exp = local_2a8.exp;
    local_258->neg = local_2a8.neg;
    local_258->fpclass = local_2a8.fpclass;
    local_258->prec_elem = local_2a8.prec_elem;
  }
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxResidualActivity(SPxLPBase<R>& lp, int rowNumber, int colNumber,
      R& minAct, R& maxAct)
{
   const SVectorBase<R>& row = lp.rowVector(rowNumber);
   bool minNegInfinite = false;
   bool maxInfinite = false;

   minAct = 0;   // this is the minimum value that the aggregation can attain
   maxAct = 0;   // this is the maximum value that the aggregation can attain

   for(int l = 0; l < row.size(); ++l)
   {
      if(colNumber < 0 || row.index(l) != colNumber)
      {
         // computing the minimum activity of the aggregated variables
         if(GT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.lower(row.index(l)) <= R(-infinity))
               minNegInfinite = true;
            else
               minAct += row.value(l) * lp.lower(row.index(l));
         }
         else if(LT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.upper(row.index(l)) >= R(infinity))
               minNegInfinite = true;
            else
               minAct += row.value(l) * lp.upper(row.index(l));
         }

         // computing the maximum activity of the aggregated variables
         if(GT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.upper(row.index(l)) >= R(infinity))
               maxInfinite = true;
            else
               maxAct += row.value(l) * lp.upper(row.index(l));
         }
         else if(LT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.lower(row.index(l)) <= R(-infinity))
               maxInfinite = true;
            else
               maxAct += row.value(l) * lp.lower(row.index(l));
         }
      }
   }

   // if an infinite value exists for the minimum activity, then that it taken
   if(minNegInfinite)
      minAct = R(-infinity);

   // if an -infinite value exists for the maximum activity, then that value is taken
   if(maxInfinite)
      maxAct = R(infinity);
}